

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cw-out.c
# Opt level: O2

CURLcode cw_out_flush(Curl_easy *data,_Bool unpause,_Bool flush_all)

{
  byte bVar1;
  CURLcode CVar2;
  cw_out_ctx *ctx_00;
  CURLcode CVar3;
  cw_out_ctx *ctx;
  bool flush_all_00;
  
  ctx_00 = (cw_out_ctx *)Curl_cwriter_get_by_type(data,&Curl_cwt_out);
  CVar3 = CURLE_OK;
  if (ctx_00 != (cw_out_ctx *)0x0) {
    bVar1 = ctx_00->field_0x28;
    if ((bVar1 & 2) == 0) {
      flush_all_00 = (bVar1 & 1) == 0;
      if (unpause && !flush_all_00) {
        bVar1 = bVar1 & 0xfc;
        ctx_00->field_0x28 = bVar1;
      }
      if ((bVar1 & 1) == 0) {
        CVar2 = cw_out_flush_chain(ctx_00,data,&ctx_00->buf,flush_all_00);
        CVar3 = CURLE_OK;
        if (CVar2 != CURLE_OK) {
          ctx_00->field_0x28 = ctx_00->field_0x28 | 2;
          cw_out_bufs_free(ctx_00);
          CVar3 = CVar2;
        }
      }
    }
    else {
      CVar3 = CURLE_WRITE_ERROR;
    }
  }
  return CVar3;
}

Assistant:

static CURLcode cw_out_flush(struct Curl_easy *data,
                             bool unpause, bool flush_all)
{
  struct Curl_cwriter *cw_out;
  CURLcode result = CURLE_OK;

  cw_out = Curl_cwriter_get_by_type(data, &Curl_cwt_out);
  if(cw_out) {
    struct cw_out_ctx *ctx = (struct cw_out_ctx *)cw_out;
    if(ctx->errored)
      return CURLE_WRITE_ERROR;
    if(unpause && ctx->paused)
      ctx->paused = FALSE;
    if(ctx->paused)
      return CURLE_OK;  /* not doing it */

    result = cw_out_flush_chain(ctx, data, &ctx->buf, flush_all);
    if(result) {
      ctx->errored = TRUE;
      cw_out_bufs_free(ctx);
      return result;
    }
  }
  return result;
}